

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  Type TVar4;
  PolymeshInfo *pPVar5;
  double dVar6;
  double theta;
  Scene *pSVar7;
  Matrix4x4 *extraout_RDX;
  Matrix4x4 *extraout_RDX_00;
  Matrix4x4 *pMVar8;
  pointer pNVar9;
  long lVar10;
  Application *this_00;
  ulong uVar11;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  Vector3D camPos;
  BBox bbox;
  undefined1 local_198 [16];
  double local_188;
  double local_180;
  undefined1 local_178 [16];
  pointer local_168;
  double local_160;
  undefined1 local_158 [8];
  SceneObject **ppSStack_150;
  Scene *local_148;
  undefined1 local_138 [8];
  SceneLight **ppSStack_130;
  Scene *local_128;
  double local_120;
  double local_118;
  double local_110;
  double dStack_108;
  pointer local_100;
  PolymeshInfo *local_f8;
  pointer pVStack_f0;
  double local_e8;
  double dStack_e0;
  pointer local_d8;
  double local_c8;
  BBox local_c0;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_78;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  local_60;
  undefined1 local_48 [16];
  
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d8 = (pointer)0x0;
  local_128 = (Scene *)0x0;
  local_138 = (undefined1  [8])0x0;
  ppSStack_130 = (SceneLight **)0x0;
  local_148 = (Scene *)0x0;
  local_158 = (undefined1  [8])0x0;
  ppSStack_150 = (SceneObject **)0x0;
  pNVar9 = (sceneInfo->nodes).
           super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((sceneInfo->nodes).
      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>._M_impl.
      super__Vector_impl_data._M_finish == pNVar9) {
    local_198 = ZEXT816(0);
    local_180 = 0.0;
  }
  else {
    local_198 = ZEXT816(0);
    lVar10 = 0x48;
    uVar11 = 0;
    local_180 = 0.0;
    this_00 = this;
    do {
      pPVar5 = *(PolymeshInfo **)((long)(pNVar9->transform).entries + lVar10 + -0x50);
      pMVar8 = (Matrix4x4 *)((long)(pNVar9->transform).entries + lVar10 + -0x48);
      TVar4 = (pPVar5->super_Instance).type;
      if (TVar4 == POLYMESH) {
        local_c0.max.x = (double)initPolymesh(this_00,pPVar5,pMVar8);
        if ((Scene *)ppSStack_150 == local_148) {
          this_00 = (Application *)local_158;
          std::
          vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                    ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                      *)this_00,(iterator)ppSStack_150,(SceneObject **)&local_c0);
        }
        else {
          *ppSStack_150 = (SceneObject *)local_c0.max.x;
          ppSStack_150 = ppSStack_150 + 1;
        }
      }
      else if (TVar4 == LIGHT) {
        local_c0.max.x = (double)initLight(this_00,(LightInfo *)pPVar5,pMVar8);
        if ((Scene *)ppSStack_130 == local_128) {
          this_00 = (Application *)local_138;
          std::
          vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneLight*>
                    ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                      *)this_00,(iterator)ppSStack_130,(SceneLight **)&local_c0);
        }
        else {
          *ppSStack_130 = (SceneLight *)local_c0.max.x;
          ppSStack_130 = ppSStack_130 + 1;
        }
      }
      else if (TVar4 == CAMERA) {
        local_178._0_8_ =
             (pPVar5->vertices).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_178._8_8_ =
             (pPVar5->vertices).
             super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_168 = (pPVar5->vertices).
                    super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_160 = 1.0;
        Matrix4x4::operator*(pMVar8,(Vector4D *)local_178);
        Vector4D::to3D((Vector4D *)&local_c0);
        local_d8 = local_100;
        local_e8 = local_110;
        dStack_e0 = dStack_108;
        local_178._0_8_ =
             (pPVar5->normals).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_178._8_8_ =
             (pPVar5->normals).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_168 = (pPVar5->normals).
                    super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_160 = 1.0;
        Matrix4x4::operator*(pMVar8,(Vector4D *)local_178);
        Vector4D::to3D((Vector4D *)&local_c0);
        dVar6 = (double)local_100 * (double)local_100 +
                local_110 * local_110 + dStack_108 * dStack_108;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
          pMVar8 = extraout_RDX_00;
        }
        else {
          dVar6 = SQRT(dVar6);
          pMVar8 = extraout_RDX;
        }
        dVar6 = 1.0 / dVar6;
        local_180 = local_110 * dVar6;
        local_f8 = (PolymeshInfo *)dStack_108;
        pVStack_f0 = local_100;
        this_00 = this;
        initCamera(this,(CameraInfo *)pPVar5,pMVar8);
        local_198._8_4_ = SUB84(dVar6 * (double)pVStack_f0,0);
        local_198._0_8_ = dVar6 * (double)local_f8;
        local_198._12_4_ = (int)((ulong)(dVar6 * (double)pVStack_f0) >> 0x20);
        local_f8 = pPVar5;
      }
      uVar11 = uVar11 + 1;
      pNVar9 = (sceneInfo->nodes).
               super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 200;
    } while (uVar11 < (ulong)(((long)(sceneInfo->nodes).
                                     super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 3)
                             * -0x70a3d70a3d70a3d7));
  }
  pSVar7 = (Scene *)operator_new(0x630);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector(&local_60,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)local_158);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector(&local_78,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)local_138);
  DynamicScene::Scene::Scene(pSVar7,&local_60,&local_78,&sceneInfo->base_shader_dir);
  this->scene = pSVar7;
  if (local_78.
      super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar5 = local_f8;
  if (local_60.
      super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pSVar7 = this->scene;
  pSVar7->camera_ = &this->camera;
  DynamicScene::Scene::getBBox(&local_c0,pSVar7);
  if (((local_c0.min.x <= local_c0.max.x) && (local_c0.min.y <= local_c0.max.y)) &&
     (local_c0.min.z <= local_c0.max.z)) {
    local_168 = (pointer)((local_c0.min.z + local_c0.max.z) * 0.5);
    dVar6 = (local_c0.max.y + local_c0.min.y) * 0.5;
    local_178._8_4_ = SUB84(dVar6,0);
    local_178._0_8_ = (local_c0.max.x + local_c0.min.x) * 0.5;
    local_178._12_4_ = (int)((ulong)dVar6 >> 0x20);
    dVar6 = local_c0.extent.z * local_c0.extent.z +
            local_c0.extent.x * local_c0.extent.x + local_c0.extent.y * local_c0.extent.y;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    local_118 = dVar6 * 0.5 * 1.5;
    this->canonicalViewDistance = local_118;
    local_120 = local_118 / 10.0;
    local_188 = local_118 + local_118;
    local_118 = local_118 * 20.0;
    local_c8 = acos((double)local_198._0_8_);
    local_48._8_4_ = local_198._8_4_;
    local_48._0_8_ = local_198._8_8_;
    local_48._12_4_ = local_198._12_4_;
    dVar6 = atan2(local_180,local_198._8_8_);
    Camera::place(&this->canonicalCamera,(Vector3D *)local_178,local_c8,dVar6,local_188,local_120,
                  local_118);
    if (*(char *)&(pPVar5->polygons).
                  super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
      local_168 = local_d8;
      local_178._8_8_ = dStack_e0;
      local_178._0_8_ = local_e8;
      pVVar1 = (pPVar5->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (pPVar5->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar3 = (pPVar5->normals).
               super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_188 = (double)pVVar3 * (double)pVVar3 +
                  (double)pVVar1 * (double)pVVar1 + (double)pVVar2 * (double)pVVar2;
      if (local_188 < 0.0) {
        local_188 = sqrt(local_188);
      }
      else {
        local_188 = SQRT(local_188);
      }
    }
    dVar6 = acos((double)local_198._0_8_);
    theta = atan2(local_180,(double)local_48._0_8_);
    Camera::place(&this->camera,(Vector3D *)local_178,dVar6,theta,local_188,local_120,local_118);
    this->scrollRate = this->canonicalViewDistance / 10.0;
  }
  if (local_158 != (undefined1  [8])0x0) {
    operator_delete((void *)local_158);
  }
  if (local_138 != (undefined1  [8])0x0) {
    operator_delete((void *)local_138);
  }
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

    // save camera position to update camera control later
    CameraInfo* camInfo;
    Vector3D camPos, camDir;
 
    vector<DynamicScene::SceneLight*> lights;
    vector<DynamicScene::SceneObject*> objects;

    vector<Collada::Node>& nodes = sceneInfo->nodes;

    for (size_t i=0; i<nodes.size(); i++) {
        Collada::Node& node = nodes[i];
        Collada::Instance* instance = node.instance;
        const Matrix4x4& transform = node.transform;

        switch (instance->type) {
          case Collada::Instance::CAMERA: {
              // printf("Creating camera\n"); fflush(stdout);
              camInfo = static_cast<CameraInfo*>(instance);
              camPos = (transform * Vector4D(camInfo->pos, 1)).to3D();
              camDir = (transform * Vector4D(camInfo->view_dir, 1)).to3D().unit();
              initCamera(*camInfo, transform);
              break;
          }
          case Collada::Instance::LIGHT: {
              // printf("Creating light\n"); fflush(stdout);  
              lights.push_back(
                  initLight(static_cast<LightInfo&>(*instance), transform));
              break;
          }
          case Collada::Instance::POLYMESH: {
              // printf("Creating mesh\n"); fflush(stdout);  
              objects.push_back(
                  initPolymesh(static_cast<PolymeshInfo&>(*instance), transform));
              break;
          }
        default:
            // unsupported instance type
            break;
        }
    }

    // create the scene
    scene = new DynamicScene::Scene(objects, lights, sceneInfo->base_shader_dir);
    scene->setCamera(&camera);  

    // given the size of the scene, determine a "canonical" camera position that's
    // outside the bounds of the scene's geometry
    BBox bbox = scene->getBBox();
    if (!bbox.empty()) {
        Vector3D target = bbox.centroid();
        canonicalViewDistance = bbox.extent.norm() / 2.0 * 1.5;

        double viewDistance = canonicalViewDistance * 2;
        double minViewDistance = canonicalViewDistance / 10.0;
        double maxViewDistance = canonicalViewDistance * 20.0;

      	canonicalCamera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                              viewDistance, minViewDistance, maxViewDistance);

    	  if (!camInfo->default_flag) {
		        target = camPos;
		        viewDistance = camInfo->view_dir.norm();
        }

        camera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                     viewDistance, minViewDistance, maxViewDistance);

        setScrollRate();
    }
}